

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void __thiscall Js::Profiler::Profiler(Profiler *this,ArenaAllocator *allocator)

{
  int local_1c;
  int i;
  ArenaAllocator *allocator_local;
  Profiler *this_local;
  
  FixedStack<Js::TimeEntry,_20>::FixedStack(&this->timeStack);
  TreeNode<Js::UnitData,_373>::TreeNode(&this->rootNode,(TreeNode<Js::UnitData,_373> *)0x0);
  this->alloc = allocator;
  this->curNode = &this->rootNode;
  for (local_1c = 0; local_1c < 0x175; local_1c = local_1c + 1) {
    this->inclSumAtLevel[local_1c] = 0;
  }
  return;
}

Assistant:

Profiler::Profiler(ArenaAllocator * allocator) :
        alloc(allocator),
        rootNode(NULL)
    {
        this->curNode = &this->rootNode;

        for(int i = 0; i < PhaseCount; i++)
        {
            this->inclSumAtLevel[i] = 0;
        }
    }